

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O0

void expression(item *x)

{
  int op_00;
  item *x_00;
  item *y;
  int op;
  item *x_local;
  
  x_00 = (item *)calloc(1,0x30);
  simpleExpression(x);
  op_00 = currentSymbol;
  if (((((currentSymbol == 0x6a) || (currentSymbol == 0x6b)) || (currentSymbol == 0x69)) ||
      ((currentSymbol == 0x68 || (currentSymbol == 0x67)))) || (currentSymbol == 0x66)) {
    getSymbol();
    if (currentSymbol == 0x26a) {
      getSymbol();
      if ((op_00 != 0x66) && (op_00 != 0x69)) {
        mark("NULL in incompatible relation");
        exit(-1);
      }
      nullRelation(op_00,x);
    }
    else {
      simpleExpression(x_00);
      relation(op_00,x,x_00);
    }
  }
  return;
}

Assistant:

procedure 
void expression(struct item *x) {
	variable int op;
	variable struct item *y;
	y = NULL; op=0;
	allocMem(y);
	simpleExpression(x);
	if ((currentSymbol == SYMBOL_LESS) || (currentSymbol == SYMBOL_GREATER) ||
		(currentSymbol == SYMBOL_NOT)  || (currentSymbol == SYMBOL_GEQ) ||
		(currentSymbol == SYMBOL_LEQ)  || (currentSymbol == SYMBOL_EQUALTEST)) {
		op = currentSymbol;
		getSymbol();
		if (currentSymbol == SYMBOL_NULL) { /* handle null relation */
			getSymbol();
			if ((op == SYMBOL_EQUALTEST) || (op == SYMBOL_NOT)) {
				nullRelation(op,x);
			} else {
				mark("NULL in incompatible relation");
				exit(-1);
			}
		} else {
			simpleExpression(y);
			relation(op,x,y);
		}
	}
}